

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_twod_node(REF_NODE ref_node)

{
  uint uVar1;
  long lVar2;
  REF_DBL m [6];
  REF_DBL aRStack_68 [2];
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_40;
  
  if (0 < ref_node->max) {
    lVar2 = 0;
    do {
      if (-1 < ref_node->global[lVar2]) {
        uVar1 = ref_node_metric_get(ref_node,(REF_INT)lVar2,aRStack_68);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x18c,"ref_metric_twod_node",(ulong)uVar1,"get");
          return uVar1;
        }
        local_58 = 0;
        local_48 = 0;
        local_40 = 0x3ff0000000000000;
        uVar1 = ref_node_metric_set(ref_node,(REF_INT)lVar2,aRStack_68);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 400,"ref_metric_twod_node",(ulong)uVar1,"set");
          return uVar1;
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < ref_node->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_twod_node(REF_NODE ref_node) {
  REF_INT node;
  REF_DBL m[6];

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_node_metric_get(ref_node, node, m), "get");
    m[2] = 0.0;
    m[4] = 0.0;
    m[5] = 1.0;
    RSS(ref_node_metric_set(ref_node, node, m), "set");
  }

  return REF_SUCCESS;
}